

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O3

void __thiscall nigel::AST_Parser::fillSFR(AST_Parser *this,shared_ptr<nigel::AstBlock> *block)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  list<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>,_std::allocator<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>_>_>
  *plVar3;
  undefined1 local_b9;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_78;
  BasicType local_6c [2];
  MemModel local_64;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nigel::AstVariable>_>,_unsigned_long>
  local_60;
  
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x80;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [4])"@P0",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@P0","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  paVar1 = &local_60.first.first.field_2;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x90;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [4])"@P1",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@P1","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0xa0;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [4])"@P2",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@P2","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0xb0;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [4])"@P3",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@P3","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x8a;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [5])"@TL0",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TL0","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x8b;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [5])"@TH0",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TH0","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x8c;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [5])"@TL1",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TL1","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x8d;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[5],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [5])"@TH1",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TH1","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x89;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [6])"@TMOD",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TMOD","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x88;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [6])"@TCON",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@TCON","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0xb8;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [4])"@IP",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@IP","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0xa8;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[4],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [4])"@IE",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@IE","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x87;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [6])"@PCON",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@PCON","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x98;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [6])"@SCON",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@SCON","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  peVar2 = (block->super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_64 = fast;
  local_6c[1] = 0x99;
  local_6c[0] = tByte;
  std::__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstVariable>,nigel::MemModel,char_const(&)[6],int,nigel::BasicType>
            ((__shared_ptr<nigel::AstVariable,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (allocator<nigel::AstVariable> *)&local_b9,&local_64,(char (*) [6])"@SBUF",
             (int *)(local_6c + 1),local_6c);
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"@SBUF","");
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Stack_b0;
  local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_b8;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar3 = &peVar2->variables;
  if (local_a0 == &local_90) {
    local_60.first.first.field_2._8_8_ = local_90._8_8_;
    local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.first.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_60.first.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_60.first.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_60.first.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80 = 0;
  p_Stack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.second = 0;
  local_a0 = &local_90;
  std::__cxx11::
  list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
  ::
  _M_insert<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>
            ((list<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::shared_ptr<nigel::AstVariable>>,unsigned_long>>>
              *)plVar3,(iterator)plVar3,&local_60);
  if (local_60.first.second.super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.first.second.
               super___shared_ptr<nigel::AstVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  if (p_Stack_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  return;
}

Assistant:

void AST_Parser::fillSFR( std::shared_ptr<AstBlock> block )
	{
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P0", std::make_shared<AstVariable>( MemModel::fast, "@P0", 0x80, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P1", std::make_shared<AstVariable>( MemModel::fast, "@P1", 0x90, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P2", std::make_shared<AstVariable>( MemModel::fast, "@P2", 0xA0, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@P3", std::make_shared<AstVariable>( MemModel::fast, "@P3", 0xB0, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TL0", std::make_shared<AstVariable>( MemModel::fast, "@TL0", 0x8A, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TH0", std::make_shared<AstVariable>( MemModel::fast, "@TH0", 0x8B, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TL1", std::make_shared<AstVariable>( MemModel::fast, "@TL1", 0x8C, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TH1", std::make_shared<AstVariable>( MemModel::fast, "@TH1", 0x8D, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TMOD", std::make_shared<AstVariable>( MemModel::fast, "@TMOD", 0x89, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@TCON", std::make_shared<AstVariable>( MemModel::fast, "@TCON", 0x88, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@IP", std::make_shared<AstVariable>( MemModel::fast, "@IP", 0xB8, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@IE", std::make_shared<AstVariable>( MemModel::fast, "@IE", 0xA8, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@PCON", std::make_shared<AstVariable>( MemModel::fast, "@PCON", 0x87, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@SCON", std::make_shared<AstVariable>( MemModel::fast, "@SCON", 0x98, BasicType::tByte ) ), 0 ) );
		block->variables.push_back( std::pair<VariableBinding, size_t>( VariableBinding( "@SBUF", std::make_shared<AstVariable>( MemModel::fast, "@SBUF", 0x99, BasicType::tByte ) ), 0 ) );
	}